

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void vkt::Draw::transition2DImage
               (DeviceInterface *vk,VkCommandBuffer cmdBuffer,VkImage image,
               VkImageAspectFlags aspectMask,VkImageLayout oldLayout,VkImageLayout newLayout,
               VkAccessFlags srcAccessMask,VkAccessFlags dstAccessMask)

{
  undefined1 local_78 [8];
  VkImageMemoryBarrier barrier;
  VkImageLayout newLayout_local;
  VkImageLayout oldLayout_local;
  VkImageAspectFlags aspectMask_local;
  VkCommandBuffer cmdBuffer_local;
  DeviceInterface *vk_local;
  VkImage image_local;
  
  barrier._68_4_ = newLayout;
  ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier((VkImageMemoryBarrier *)local_78);
  local_78._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  barrier._4_4_ = 0;
  barrier.pNext._0_4_ = srcAccessMask;
  barrier.pNext._4_4_ = dstAccessMask;
  barrier.dstAccessMask = barrier._68_4_;
  barrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  barrier.image.m_internal._4_4_ = 0;
  barrier.subresourceRange.aspectMask = 1;
  barrier.subresourceRange.baseMipLevel = 0;
  barrier.subresourceRange.levelCount = 1;
  barrier.srcAccessMask = oldLayout;
  barrier._32_8_ = image.m_internal;
  barrier.image.m_internal._0_4_ = aspectMask;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,cmdBuffer,0x8000,1,0,0,0,0,0,1,local_78);
  return;
}

Assistant:

void transition2DImage (const vk::DeviceInterface&	vk,
						vk::VkCommandBuffer			cmdBuffer,
						vk::VkImage					image,
						vk::VkImageAspectFlags		aspectMask,
						vk::VkImageLayout			oldLayout,
						vk::VkImageLayout			newLayout,
						vk::VkAccessFlags			srcAccessMask,
						vk::VkAccessFlags			dstAccessMask)
{
	vk::VkImageMemoryBarrier barrier;
	barrier.sType							= vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
	barrier.pNext							= DE_NULL;
	barrier.srcAccessMask					= srcAccessMask;
	barrier.dstAccessMask					= dstAccessMask;
	barrier.oldLayout						= oldLayout;
	barrier.newLayout						= newLayout;
	barrier.srcQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.dstQueueFamilyIndex				= VK_QUEUE_FAMILY_IGNORED;
	barrier.image							= image;
	barrier.subresourceRange.aspectMask		= aspectMask;
	barrier.subresourceRange.baseMipLevel	= 0;
	barrier.subresourceRange.levelCount		= 1;
	barrier.subresourceRange.baseArrayLayer = 0;
	barrier.subresourceRange.layerCount		= 1;

	vk.cmdPipelineBarrier(cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						  0, (const vk::VkMemoryBarrier*)DE_NULL,
						  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						  1, &barrier);
}